

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

int __thiscall Fl_Group::remove(Fl_Group *this,char *__filename)

{
  int iVar1;
  int extraout_EAX;
  Fl_Group *pFVar2;
  Fl_Widget *pFVar3;
  Fl_Widget *t;
  Fl_Widget *o;
  int index_local;
  Fl_Group *this_local;
  
  o._4_4_ = (int)__filename;
  pFVar2 = this;
  if ((o._4_4_ < 0) ||
     (pFVar2 = (Fl_Group *)((ulong)__filename & 0xffffffff), this->children_ <= o._4_4_)) {
    iVar1 = (int)pFVar2;
  }
  else {
    pFVar3 = child(this,o._4_4_);
    if (pFVar3 == this->savedfocus_) {
      this->savedfocus_ = (Fl_Widget *)0x0;
    }
    if (pFVar3->parent_ == this) {
      pFVar3->parent_ = (Fl_Group *)0x0;
    }
    this->children_ = this->children_ + -1;
    if (this->children_ == 1) {
      pFVar3 = this->array_[(o._4_4_ != 0 ^ 0xffU) & 1];
      free(this->array_);
      this->array_ = (Fl_Widget **)pFVar3;
    }
    else if (1 < this->children_) {
      for (; o._4_4_ < this->children_; o._4_4_ = o._4_4_ + 1) {
        this->array_[o._4_4_] = this->array_[o._4_4_ + 1];
      }
    }
    init_sizes(this);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void Fl_Group::remove(int index) {
  if (index < 0 || index >= children_) return;
  Fl_Widget &o = *child(index);
  if (&o == savedfocus_) savedfocus_ = 0;
  if (o.parent_ == this) {	// this should always be true
    o.parent_ = 0;
  } 

  // remove the widget from the group

  children_--;
  if (children_ == 1) { // go from 2 to 1 child
    Fl_Widget *t = array_[!index];
    free((void*)array_);
    array_ = (Fl_Widget**)t;
  } else if (children_ > 1) { // delete from array
    for (; index < children_; index++) array_[index] = array_[index+1];
  }
  init_sizes();
}